

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O1

void __thiscall duckdb::DbpEncoder::FinishWrite(DbpEncoder *this,WriteStream *writer)

{
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->count + this->block_count != this->total_value_count) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"value count mismatch when writing DELTA_BINARY_PACKED","");
    duckdb::InternalException::InternalException(this_00,(string *)local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->block_count != 0) {
    WriteBlock(this,writer);
    return;
  }
  return;
}

Assistant:

void FinishWrite(WriteStream &writer) {
		if (count + block_count != total_value_count) {
			throw InternalException("value count mismatch when writing DELTA_BINARY_PACKED");
		}
		if (block_count != 0) {
			WriteBlock(writer);
		}
	}